

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

void cmac_gfmul(uint8_t *block)

{
  byte bVar1;
  byte bVar2;
  int i;
  uint uVar3;
  
  bVar2 = 0;
  for (uVar3 = 0xf; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    bVar1 = block[uVar3];
    block[uVar3] = bVar2 >> 7 | bVar1 * '\x02';
    bVar2 = bVar1;
  }
  block[0xf] = block[0xf] ^ (char)bVar2 >> 7 & 0x87U;
  return;
}

Assistant:

static void cmac_gfmul(uint8_t* block)
{
    uint8_t carry = 0;
    for (int i = 15; i >= 0; i--)
    {
        uint8_t x = block[i];
        block[i] = (block[i] << 1) | (carry >> 7);
        carry = x;
    }

    block[15] ^= (carry & 0x80 ? 0x87 : 0);
}